

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall
AbstractModuleClient::sendGlobalStimulationCommand
          (AbstractModuleClient *this,GlobalStimulationCommand *command)

{
  byte bVar1;
  binarydata *in_stack_00000068;
  char *in_stack_00000070;
  string *in_stack_00000078;
  TrodesMsg m;
  GlobalStimulationCommand *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  TrodesMsg *in_stack_ffffffffffffff70;
  allocator local_59;
  string local_58 [24];
  TrodesMsg *in_stack_ffffffffffffffc0;
  MlmWrap *in_stack_ffffffffffffffc8;
  
  TrodesMsg::TrodesMsg(in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"sn",&local_59);
  GlobalStimulationCommand::encode(in_stack_ffffffffffffff48);
  TrodesMsg::addcontents<char_const*,binarydata>
            ((TrodesMsg *)m.format._0_8_,in_stack_00000078,in_stack_00000070,in_stack_00000068);
  binarydata::~binarydata((binarydata *)0x335308);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = MlmWrap::sendHardwareMessage(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TrodesMsg::~TrodesMsg((TrodesMsg *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  return (bool)(bVar1 & 1);
}

Assistant:

bool AbstractModuleClient::sendGlobalStimulationCommand(GlobalStimulationCommand command){
    TrodesMsg m;
    m.addcontents("sn", "SETGC", command.encode());
    return sendHardwareMessage(m);
}